

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::NullTypeHandlerBase::SetPropertyWithAttributes
          (NullTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  BOOL BVar1;
  uint32 local_34 [2];
  uint32 indexVal;
  
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_34);
  if (BVar1 == 0) {
    BVar1 = AddProperty(this,instance,propertyId,value,attributes,info,flags,possibleSideEffects);
  }
  else {
    BVar1 = DynamicTypeHandler::SetItemWithAttributes
                      (&this->super_DynamicTypeHandler,instance,local_34[0],value,attributes);
  }
  return BVar1;
}

Assistant:

BOOL NullTypeHandlerBase::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        // Always check numeric propertyId. May create objectArray.
        uint32 indexVal;
        if (instance->GetScriptContext()->IsNumericPropertyId(propertyId, &indexVal))
        {
            return NullTypeHandlerBase::SetItemWithAttributes(instance, indexVal, value, attributes);
        }

        return this->AddProperty(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
    }